

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackgroundParser.cpp
# Opt level: O3

bool __thiscall
BackgroundParser::Process
          (BackgroundParser *this,Job *job,Parser *parser,CompileScriptException *pse)

{
  code *pcVar1;
  bool bVar2;
  HRESULT HVar3;
  int iVar4;
  undefined4 *puVar5;
  
  if (parser->currBackgroundParseItem != (BackgroundParseItem *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/BackgroundParser.cpp"
                       ,0x5e,"(parser->GetCurrBackgroundParseItem() == nullptr)",
                       "parser->GetCurrBackgroundParseItem() == nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  parser->currBackgroundParseItem = (BackgroundParseItem *)job;
  job[3].super_DoublyLinkedListElement<JsUtil::Job,_Memory::ArenaAllocator>.next = (Type)parser;
  HVar3 = Parser::ParseFunctionInBackground
                    (parser,(ParseNodeFnc *)
                            job[4].
                            super_DoublyLinkedListElement<JsUtil::Job,_Memory::ArenaAllocator>.next,
                     (ParseContext *)(job + 1),
                     *(bool *)&job[5].
                               super_DoublyLinkedListElement<JsUtil::Job,_Memory::ArenaAllocator>.
                               next,pse);
  iVar4 = Parser::GetLastBlockId(parser);
  *(int *)((long)&job[5].super_DoublyLinkedListElement<JsUtil::Job,_Memory::ArenaAllocator>.previous
          + 4) = iVar4;
  *(HRESULT *)&job[5].super_DoublyLinkedListElement<JsUtil::Job,_Memory::ArenaAllocator>.previous =
       HVar3;
  if (HVar3 < 0) {
    job[4].manager = (JobManager *)pse;
  }
  *(undefined1 *)
   ((long)&job[5].super_DoublyLinkedListElement<JsUtil::Job,_Memory::ArenaAllocator>.next + 3) = 1;
  parser->currBackgroundParseItem = (BackgroundParseItem *)0x0;
  return HVar3 == 0;
}

Assistant:

bool BackgroundParser::Process(JsUtil::Job *const job, Parser *parser, CompileScriptException *pse)
{
    BackgroundParseItem *backgroundItem = static_cast<BackgroundParseItem*>(job);

    Assert(parser->GetCurrBackgroundParseItem() == nullptr);
    parser->SetCurrBackgroundParseItem(backgroundItem);
    backgroundItem->SetParser(parser);

    HRESULT hr = parser->ParseFunctionInBackground(backgroundItem->GetParseNode(), backgroundItem->GetParseContext(), backgroundItem->IsDeferred(), pse);
    backgroundItem->SetMaxBlockId(parser->GetLastBlockId());
    backgroundItem->SetHR(hr);
    if (FAILED(hr))
    {
        backgroundItem->SetPSE(pse);
    }
    backgroundItem->SetCompleted(true);
    parser->SetCurrBackgroundParseItem(nullptr);
    return hr == S_OK;
}